

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BiDirectionalLSTMLayerParams::BiDirectionalLSTMLayerParams
          (BiDirectionalLSTMLayerParams *this,BiDirectionalLSTMLayerParams *from)

{
  bool bVar1;
  InternalMetadataWithArenaLite *this_00;
  LSTMParams *this_01;
  BiDirectionalLSTMLayerParams *from_local;
  BiDirectionalLSTMLayerParams *this_local;
  Container *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__BiDirectionalLSTMLayerParams_00d572e8;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::RepeatedPtrField
            (&this->activationsforwardlstm_,&from->activationsforwardlstm_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::RepeatedPtrField
            (&this->activationsbackwardlstm_,&from->activationsbackwardlstm_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::RepeatedPtrField
            (&this->weightparams_,&from->weightparams_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,&local_20->unknown_fields);
  }
  bVar1 = has_params(from);
  if (bVar1) {
    this_01 = (LSTMParams *)operator_new(0x20);
    LSTMParams::LSTMParams(this_01,from->params_);
    this->params_ = this_01;
  }
  else {
    this->params_ = (LSTMParams *)0x0;
  }
  memcpy(&this->inputvectorsize_,&from->inputvectorsize_,0x10);
  return;
}

Assistant:

BiDirectionalLSTMLayerParams::BiDirectionalLSTMLayerParams(const BiDirectionalLSTMLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      activationsforwardlstm_(from.activationsforwardlstm_),
      activationsbackwardlstm_(from.activationsbackwardlstm_),
      weightparams_(from.weightparams_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_params()) {
    params_ = new ::CoreML::Specification::LSTMParams(*from.params_);
  } else {
    params_ = NULL;
  }
  ::memcpy(&inputvectorsize_, &from.inputvectorsize_,
    reinterpret_cast<char*>(&outputvectorsize_) -
    reinterpret_cast<char*>(&inputvectorsize_) + sizeof(outputvectorsize_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.BiDirectionalLSTMLayerParams)
}